

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.cpp
# Opt level: O0

bool ThreadContextTLSEntry::ClearThreadContext
               (ThreadContextTLSEntry *entry,bool isThreadContextValid,bool force)

{
  bool bVar1;
  bool force_local;
  bool isThreadContextValid_local;
  ThreadContextTLSEntry *entry_local;
  
  if (entry != (ThreadContextTLSEntry *)0x0) {
    if ((entry->threadContext != (ThreadContext *)0x0) && (isThreadContextValid)) {
      if ((!force) &&
         ((bVar1 = ThreadContext::IsThreadBound(entry->threadContext), bVar1 ||
          (bVar1 = ThreadContext::IsInScript(entry->threadContext), bVar1)))) {
        return false;
      }
      ThreadContext::SetCurrentThreadId(entry->threadContext,0xffffffff);
      ThreadContext::SetStackProber(entry->threadContext,(StackProber *)0x0);
    }
    entry->threadContext = (ThreadContext *)0x0;
  }
  return true;
}

Assistant:

bool ThreadContextTLSEntry::ClearThreadContext(ThreadContextTLSEntry * entry, bool isThreadContextValid, bool force)
{
    ASSERT_ENTRY_INITIALIZED();

    if (entry != NULL)
    {
        if (entry->threadContext != NULL && isThreadContextValid)
        {
            // If the thread has an active thread context and either that thread context is thread
            // bound (in which case it cannot be moved off this thread), or if the thread context
            // is running script, you cannot move it off this thread.
            if (!force && (entry->threadContext->IsThreadBound() || entry->threadContext->IsInScript()))
            {
                return false;
            }
            entry->threadContext->SetCurrentThreadId(ThreadContext::NoThread);
            entry->threadContext->SetStackProber(NULL);
        }

        entry->threadContext = NULL;
    }

    return true;
}